

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

size_t __thiscall DROPlayer::DeviceID2OptionID(DROPlayer *this,UINT32 id)

{
  pointer puVar1;
  uchar uVar2;
  
  if ((int)id < 0) {
    uVar2 = (uchar)id;
    id = id >> 0x10;
  }
  else {
    puVar1 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_devTypes).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) <= (ulong)id) {
      return 0xffffffffffffffff;
    }
    uVar2 = puVar1[id];
  }
  if (uVar2 == '\t') {
    if ((id & 0xff) < 2) {
      return (ulong)(id & 0xff);
    }
  }
  else if ((char)id == '\0' && uVar2 == '\f') {
    return 2;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t DROPlayer::DeviceID2OptionID(UINT32 id) const
{
	UINT8 type;
	UINT8 instance;
	
	if (id & 0x80000000)
	{
		type = (id >> 0) & 0xFF;
		instance = (id >> 16) & 0xFF;
	}
	else if (id < _devTypes.size())
	{
		type = _devTypes[id];
		instance = (UINT8)id;
	}
	else
	{
		return (size_t)-1;
	}
	
	if (type == DEVID_YM3812)
	{
		if (instance < 2)
			return 0 + instance;
	}
	else if (type == DEVID_YMF262)
	{
		if (instance < 1)
			return 2 + instance;
	}
	return (size_t)-1;
}